

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__info_main(stbi__context *s,int *x,int *y,int *comp)

{
  int iVar1;
  uint uVar2;
  stbi_uc *psVar3;
  int iVar4;
  stbi__jpeg j;
  undefined8 local_4888;
  
  local_4888 = s;
  iVar1 = stbi__decode_jpeg_header((stbi__jpeg *)&local_4888,2);
  if (iVar1 == 0) {
    local_4888->img_buffer = local_4888->img_buffer_original;
  }
  else {
    if (x != (int *)0x0) {
      *x = local_4888->img_x;
    }
    if (y != (int *)0x0) {
      *y = local_4888->img_y;
    }
    if (comp != (int *)0x0) {
      *comp = local_4888->img_n;
    }
  }
  if (iVar1 != 0) {
    return 1;
  }
  local_4888 = s;
  iVar1 = stbi__parse_png_file((stbi__png *)&local_4888,2,0);
  if (iVar1 == 0) {
    local_4888->img_buffer = local_4888->img_buffer_original;
  }
  else {
    if (x != (int *)0x0) {
      *x = local_4888->img_x;
    }
    if (y != (int *)0x0) {
      *y = local_4888->img_y;
    }
    if (comp != (int *)0x0) {
      *comp = local_4888->img_n;
    }
  }
  if (iVar1 != 0) {
    return 1;
  }
  iVar1 = stbi__gif_header(s,(stbi__gif *)&local_4888,comp,1);
  if (iVar1 == 0) {
    s->img_buffer = s->img_buffer_original;
  }
  else {
    if (x != (int *)0x0) {
      *x = (int)local_4888;
    }
    if (y != (int *)0x0) {
      *y = local_4888._4_4_;
    }
  }
  iVar4 = 1;
  if (iVar1 != 0) {
    return 1;
  }
  psVar3 = s->img_buffer;
  if (s->img_buffer_end <= psVar3) {
    if (s->read_from_callbacks == 0) goto LAB_0010503b;
    psVar3 = s->buffer_start;
    iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
    if (iVar1 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar3;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar3;
      s->img_buffer_end = psVar3 + iVar1;
    }
    psVar3 = s->img_buffer;
  }
  s->img_buffer = psVar3 + 1;
  if (*psVar3 != 'B') goto LAB_0010503b;
  psVar3 = s->img_buffer;
  if (s->img_buffer_end <= psVar3) {
    if (s->read_from_callbacks == 0) goto LAB_0010503b;
    psVar3 = s->buffer_start;
    iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
    if (iVar1 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar3;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar3;
      s->img_buffer_end = psVar3 + iVar1;
    }
    psVar3 = s->img_buffer;
  }
  s->img_buffer = psVar3 + 1;
  if (*psVar3 != 'M') goto LAB_0010503b;
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00104f9e:
    s->img_buffer = s->img_buffer + 0xc;
  }
  else {
    iVar1 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
    if (0xb < iVar1) goto LAB_00104f9e;
    s->img_buffer = s->img_buffer_end;
    (*(s->io).skip)(s->io_user_data,0xc - iVar1);
  }
  uVar2 = stbi__get16le(s);
  iVar1 = stbi__get16le(s);
  uVar2 = iVar1 << 0x10 | uVar2;
  if ((int)uVar2 < 0x38) {
    if (uVar2 != 0xc) {
      if (uVar2 != 0x28) goto LAB_0010503b;
      goto LAB_00104fe3;
    }
    iVar1 = stbi__get16le(s);
    *x = iVar1;
    uVar2 = stbi__get16le(s);
  }
  else {
    if (((uVar2 != 0x38) && (uVar2 != 0x6c)) && (uVar2 != 0x7c)) goto LAB_0010503b;
LAB_00104fe3:
    uVar2 = stbi__get16le(s);
    iVar1 = stbi__get16le(s);
    *x = iVar1 << 0x10 | uVar2;
    uVar2 = stbi__get16le(s);
    iVar1 = stbi__get16le(s);
    uVar2 = iVar1 << 0x10 | uVar2;
  }
  *y = uVar2;
  iVar1 = stbi__get16le(s);
  if (iVar1 == 1) {
    uVar2 = stbi__get16le(s);
    *comp = uVar2 >> 3;
    return 1;
  }
LAB_0010503b:
  s->img_buffer = s->img_buffer_original;
  iVar1 = stbi__psd_info(s,x,y,comp);
  if (((iVar1 == 0) && (iVar1 = stbi__pic_info(s,x,y,comp), iVar1 == 0)) &&
     ((iVar1 = stbi__pnm_info(s,x,y,comp), iVar1 == 0 &&
      ((iVar1 = stbi__hdr_info(s,x,y,comp), iVar1 == 0 &&
       (iVar1 = stbi__tga_info(s,x,y,comp), iVar1 == 0)))))) {
    stbi__g_failure_reason = "Image not of any known type, or corrupt";
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int stbi__info_main(stbi__context *s, int *x, int *y, int *comp)
{
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_info(s, x, y, comp)) return 1;
   #endif

   #ifndef STBI_NO_PNG
   if (stbi__png_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_GIF
   if (stbi__gif_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_BMP
   if (stbi__bmp_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PSD
   if (stbi__psd_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PIC
   if (stbi__pic_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PNM
   if (stbi__pnm_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_info(s, x, y, comp))  return 1;
   #endif

   // test tga last because it's a crappy test!
   #ifndef STBI_NO_TGA
   if (stbi__tga_info(s, x, y, comp))
       return 1;
   #endif
   return stbi__err("unknown image type", "Image not of any known type, or corrupt");
}